

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

expression_ptr __thiscall mjs::parser::parse_expression(parser *this)

{
  parser *in_RSI;
  undefined1 local_40 [16];
  position_stack_node _expression_position__LINE__;
  parser *this_local;
  
  position_stack_node::position_stack_node
            ((position_stack_node *)(local_40 + 8),in_RSI,&in_RSI->expression_pos_);
  parse_assignment_expression((parser *)local_40);
  parse_expression1(this,(expression_ptr *)in_RSI,(int)local_40);
  std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr
            ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_40);
  position_stack_node::~position_stack_node((position_stack_node *)(local_40 + 8));
  return (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)
         (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)this;
}

Assistant:

expression_ptr parse_expression() {
        RECORD_EXPRESSION_START;
        return parse_expression1(parse_assignment_expression(), comma_precedence);
    }